

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  iterator it;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  PositionType PVar2;
  bool bVar3;
  ReferenceType __src;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  byte bVar10;
  iterator it_00;
  SnapshotDataType in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  PositionType PStack_130;
  iterator local_128;
  undefined8 local_118 [26];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_30 [8];
  PositionType pos;
  string *fileName_local;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  bVar10 = 0;
  local_48 = (originSnapshot->Position).Tree;
  PStack_40 = (originSnapshot->Position).Position;
  pos.Position = (PositionType)fileName;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(local_118,__src,0xd0);
  PVar2 = PStack_40;
  pcVar1 = local_48;
  puVar8 = local_118;
  puVar9 = (undefined8 *)&stack0xfffffffffffffd48;
  for (lVar7 = 0x1a; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  it_00.Position = PVar2;
  it_00.Tree = pcVar1;
  _local_30 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,it_00,in_stack_fffffffffffffd48);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar4->SnapshotType = MacroCallType;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  local_138 = (pSVar4->ExecutionListFile).Tree;
  PStack_130 = (pSVar4->ExecutionListFile).Position;
  std::__cxx11::string::string((string *)&local_158,(string *)pos.Position);
  it.Position = PStack_130;
  it.Tree = local_138;
  local_128 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Push(&this->ExecutionListFiles,it,&local_158);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar4->ExecutionListFile = local_128;
  std::__cxx11::string::~string((string *)&local_158);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  bVar3 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (!bVar3) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,0x330,
                  "cmStateSnapshot cmState::CreateMacroCallSnapshot(const cmStateSnapshot &, const std::string &)"
                 );
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  (pBVar5->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_30;
  (pBVar5->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
  (pSVar6->PolicyScope).Position = (pSVar4->Policies).Position;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_30);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateMacroCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}